

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O3

BN * __thiscall BN::operator-(BN *__return_storage_ptr__,BN *this,BN *bn)

{
  BN local_30;
  
  BN(&local_30,this);
  operator-=(&local_30,bn);
  BN(__return_storage_ptr__,&local_30);
  if (local_30.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

const BN BN::operator - (const BN& bn) const
{
    return move(BN(*this) -= bn);
}